

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

_GLFWwindow * findWindowByHandle(Window handle)

{
  int iVar1;
  _GLFWwindow *in_RAX;
  _GLFWwindow *window;
  _GLFWwindow *local_8;
  
  local_8 = in_RAX;
  iVar1 = XFindContext(_glfw.x11.display,handle,_glfw.x11.context,&local_8);
  if (iVar1 != 0) {
    local_8 = (_GLFWwindow *)0x0;
  }
  return local_8;
}

Assistant:

static _GLFWwindow* findWindowByHandle(Window handle)
{
    _GLFWwindow* window;

    if (XFindContext(_glfw.x11.display,
                     handle,
                     _glfw.x11.context,
                     (XPointer*) &window) != 0)
    {
        return NULL;
    }

    return window;
}